

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O2

void __thiscall
libtorrent::torrent_need_cert_alert::~torrent_need_cert_alert(torrent_need_cert_alert *this)

{
  torrent_alert::~torrent_alert(&this->super_torrent_alert);
  operator_delete(this,0x60);
  return;
}

Assistant:

struct TORRENT_EXPORT torrent_need_cert_alert final : torrent_alert
	{
		// internal
		torrent_need_cert_alert(aux::stack_allocator& alloc
			, torrent_handle const& h);

		TORRENT_DEFINE_ALERT_PRIO(torrent_need_cert_alert, 65, alert_priority_critical)

		static constexpr alert_category_t static_category = alert_category::status;
		std::string message() const override;
#if TORRENT_ABI_VERSION == 1
		error_code const TORRENT_DEPRECATED_MEMBER error;
#endif
	}